

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparser.h
# Opt level: O2

named_arguments_t *
get_named_arguments(named_arguments_t *__return_storage_ptr__,cli_arguments_t *args)

{
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h,&(args->second)._M_h);
  return __return_storage_ptr__;
}

Assistant:

const named_arguments_t get_named_arguments(const cli_arguments_t& args) { return args.second; }